

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O2

void __thiscall
wasm::InstrumentLocals::addImport
          (InstrumentLocals *this,Module *wasm,Name name,Type params,Type results)

{
  undefined8 uVar1;
  Signature sig;
  Name name_00;
  HeapType local_50;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  sig.results.id = results.id;
  sig.params.id = params.id;
  HeapType::HeapType(&local_50,sig);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_30;
  Builder::makeFunction
            (name_00,(HeapType)name.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,(Expression *)&local_48)
  ;
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_48);
  uVar1 = DAT_00e643a0;
  *(undefined8 *)
   ((long)local_30._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18) = ENV;
  *(undefined8 *)
   ((long)local_30._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = uVar1;
  *(char **)((long)local_30._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28) =
       name.super_IString.str._M_len;
  *(uintptr_t *)
   ((long)local_30._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30) =
       name.super_IString.str._M_str;
  Module::addFunction(wasm,&local_30);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void addImport(Module* wasm, Name name, Type params, Type results) {
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    wasm->addFunction(std::move(import));
  }